

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_8::DiskHandle::read(DiskHandle *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  long __offset;
  Fault f;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __offset = CONCAT44(in_register_00000034,__fd);
  if (__nbytes == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
LAB_0034cadb:
    do {
      sVar2 = pread((this->fd).fd,__buf,__nbytes,__offset);
      if (sVar2 < 0) {
        iVar1 = _::Debug::getOsErrorNumber(false);
        if (iVar1 == -1) goto LAB_0034cadb;
        if (iVar1 != 0) {
          local_50.exception = (Exception *)0x0;
          local_48 = 0;
          uStack_40 = 0;
          _::Debug::Fault::init
                    (&local_50,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          _::Debug::Fault::fatal(&local_50);
        }
      }
      else if (sVar2 == 0) {
        return sVar3;
      }
      sVar3 = sVar3 + sVar2;
      __offset = __offset + sVar2;
      __buf = (void *)((long)__buf + sVar2);
      __nbytes = __nbytes - sVar2;
    } while (__nbytes != 0);
  }
  return sVar3;
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const {
    // pread() probably never returns short reads unless it hits EOF. Unfortunately, though, per
    // spec we are not allowed to assume this.

    size_t total = 0;
    while (buffer.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pread(fd, buffer.begin(), buffer.size(), offset));
      if (n == 0) break;
      total += n;
      offset += n;
      buffer = buffer.slice(n, buffer.size());
    }
    return total;
  }